

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O2

Vec_Str_t * Fra_SmlSimulateReadFile(char *pFileName)

{
  uint uVar1;
  FILE *__stream;
  Vec_Str_t *__ptr;
  char *__ptr_00;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  size_t __size;
  int iVar5;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    __ptr = (Vec_Str_t *)0x0;
    printf("Cannot open file \"%s\" with simulation patterns.\n",pFileName);
  }
  else {
    __ptr = (Vec_Str_t *)malloc(0x10);
    __ptr->nCap = 1000;
    __ptr->nSize = 0;
    __ptr_00 = (char *)malloc(1000);
    __ptr->pArray = __ptr_00;
    uVar4 = 0;
    iVar5 = 1000;
    do {
      while( true ) {
        uVar1 = fgetc(__stream);
        if (uVar1 == 0xffffffff) goto LAB_0055c067;
        if ((uVar1 & 0xfffffffe) != 0x30) break;
        if ((int)uVar4 == iVar5) {
          __size = (size_t)(uint)(iVar5 * 2);
          if (iVar5 < 0x10) {
            __size = 0x10;
          }
          iVar3 = (int)__size;
          if (iVar5 < iVar3) {
            if (__ptr_00 == (char *)0x0) {
              __ptr_00 = (char *)malloc(__size);
            }
            else {
              __ptr_00 = (char *)realloc(__ptr_00,__size);
            }
            __ptr->pArray = __ptr_00;
            __ptr->nCap = iVar3;
            iVar5 = iVar3;
          }
        }
        uVar2 = (int)uVar4 + 1;
        __ptr->nSize = uVar2;
        __ptr_00[uVar4] = (char)uVar1 + -0x30;
        uVar4 = (ulong)uVar2;
      }
    } while ((uVar1 < 0x21) && ((0x100002600U >> ((ulong)uVar1 & 0x3f) & 1) != 0));
    printf("File \"%s\" contains symbol (%c) other than \'0\' or \'1\'.\n",pFileName,
           (ulong)(uint)(int)(char)uVar1);
    free(__ptr_00);
    free(__ptr);
    __ptr = (Vec_Str_t *)0x0;
LAB_0055c067:
    fclose(__stream);
  }
  return __ptr;
}

Assistant:

Vec_Str_t * Fra_SmlSimulateReadFile( char * pFileName )
{
    Vec_Str_t * vRes;
    FILE * pFile;
    int c;
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" with simulation patterns.\n", pFileName );
        return NULL;
    }
    vRes = Vec_StrAlloc( 1000 );
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == '0' || c == '1' )
            Vec_StrPush( vRes, (char)(c - '0') );
        else if ( c != ' ' && c != '\r' && c != '\n' && c != '\t' )
        {
            printf( "File \"%s\" contains symbol (%c) other than \'0\' or \'1\'.\n", pFileName, (char)c );
            Vec_StrFreeP( &vRes );
            break;
        }
    }
    fclose( pFile );
    return vRes;
}